

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer2.c
# Opt level: O3

ktx_error_code_e ktxTexture2_DeflateZstd(ktxTexture2 *This,ktx_uint32_t compressionLevel)

{
  ktx_uint32_t kVar1;
  ktxTexture2_private *pkVar2;
  bool bVar3;
  uint uVar4;
  ZSTD_ErrorCode ZVar5;
  ZSTD_CCtx *cctx;
  size_t sVar6;
  void *__ptr;
  ktx_uint8_t *__dest;
  long lVar7;
  long lVar8;
  ulong __n;
  size_t dstCapacity;
  ktx_error_code_e kVar9;
  size_t __size;
  long lVar10;
  long lVar11;
  
  kVar1 = This->numLevels;
  pkVar2 = This->_private;
  cctx = ZSTD_createCCtx();
  if (cctx != (ZSTD_CCtx *)0x0) {
    if (This->supercompressionScheme != KTX_SS_BEGIN_RANGE) {
      return KTX_INVALID_OPERATION;
    }
    uVar4 = This->numLevels - 1;
    if ((int)uVar4 < 0) {
      dstCapacity = 0;
    }
    else {
      lVar10 = (ulong)uVar4 * 0x18;
      dstCapacity = 0;
      do {
        sVar6 = ZSTD_compressBound(*(size_t *)((long)&pkVar2->_levelIndex[0].byteLength + lVar10));
        dstCapacity = dstCapacity + sVar6;
        lVar10 = lVar10 + -0x18;
      } while (lVar10 != -0x18);
    }
    __n = (ulong)(kVar1 * 0x18);
    __ptr = malloc(__n + dstCapacity);
    kVar9 = KTX_OUT_OF_MEMORY;
    if (__ptr == (void *)0x0) {
LAB_0025caad:
      ZSTD_freeCCtx(cctx);
      free(__ptr);
      return kVar9;
    }
    uVar4 = This->numLevels - 1;
    if ((int)uVar4 < 0) {
      __size = 0;
    }
    else {
      lVar10 = (ulong)uVar4 * 0x18;
      __size = 0;
      lVar11 = 0;
      lVar7 = (ulong)uVar4 + 1;
      do {
        sVar6 = ZSTD_compressCCtx(cctx,(void *)((long)((long)__ptr + __n) + lVar11),dstCapacity,
                                  This->pData +
                                  *(long *)((long)&pkVar2->_levelIndex[0].byteOffset + lVar10),
                                  *(size_t *)((long)&pkVar2->_levelIndex[0].byteLength + lVar10),
                                  compressionLevel);
        uVar4 = ZSTD_isError(sVar6);
        if (uVar4 != 0) {
          free(__ptr);
          ZVar5 = ZSTD_getErrorCode(sVar6);
          if ((int)ZVar5 < 0x42) {
            kVar9 = KTX_OUT_OF_MEMORY;
            if (ZVar5 == ZSTD_error_parameter_outOfBound) {
              kVar9 = KTX_INVALID_VALUE;
              goto LAB_0025caad;
            }
            if (ZVar5 == ZSTD_error_memory_allocation) goto LAB_0025caad;
          }
          else {
            kVar9 = KTX_OUT_OF_MEMORY;
            if ((ZVar5 == ZSTD_error_workSpace_tooSmall) || (ZVar5 == ZSTD_error_dstSize_tooSmall))
            goto LAB_0025caad;
          }
          kVar9 = KTX_INVALID_OPERATION;
          goto LAB_0025caad;
        }
        *(long *)((long)__ptr + lVar10) = lVar11;
        *(undefined8 *)((long)__ptr + lVar10 + 0x10) =
             *(undefined8 *)((long)&pkVar2->_levelIndex[0].byteLength + lVar10);
        *(size_t *)((long)__ptr + lVar10 + 8) = sVar6;
        __size = __size + sVar6;
        lVar11 = lVar11 + sVar6;
        dstCapacity = dstCapacity - sVar6;
        lVar10 = lVar10 + -0x18;
        lVar8 = lVar7 + -1;
        bVar3 = 0 < lVar7;
        lVar7 = lVar8;
      } while (lVar8 != 0 && bVar3);
    }
    ZSTD_freeCCtx(cctx);
    __dest = (ktx_uint8_t *)malloc(__size);
    if (__dest != (ktx_uint8_t *)0x0) {
      memcpy(__dest,(void *)((long)__ptr + __n),__size);
      memcpy(pkVar2->_levelIndex,__ptr,__n);
      free(__ptr);
      free(This->pData);
      This->pData = __dest;
      This->dataSize = __size;
      This->supercompressionScheme = KTX_SS_ZSTD;
      This->_private->_requiredLevelAlignment = 1;
      return KTX_SUCCESS;
    }
    free(__ptr);
  }
  return KTX_OUT_OF_MEMORY;
}

Assistant:

KTX_error_code
ktxTexture2_DeflateZstd(ktxTexture2* This, ktx_uint32_t compressionLevel)
{
    ktx_uint32_t levelIndexByteLength =
                            This->numLevels * sizeof(ktxLevelIndexEntry);
    ktx_uint8_t* workBuf;
    ktx_uint8_t* cmpData;
    ktx_size_t dstRemainingByteLength = 0;
    ktx_size_t byteLengthCmp = 0;
    ktx_size_t levelOffset = 0;
    ktxLevelIndexEntry* cindex = This->_private->_levelIndex;
    ktxLevelIndexEntry* nindex;
    ktx_uint8_t* pCmpDst;
    ktx_error_code_e result;

    ZSTD_CCtx* cctx = ZSTD_createCCtx();
    if (cctx == NULL)
        return KTX_OUT_OF_MEMORY;

    if (This->supercompressionScheme != KTX_SS_NONE)
        return KTX_INVALID_OPERATION;

    // On rare occasions the deflated data can be a few bytes larger than
    // the source data. Calculating the dst buffer size using
    // ZSTD_compressBound provides a suitable size plus compression is said
    // to run faster when the dst buffer is >= compressBound.
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        dstRemainingByteLength += ZSTD_compressBound(cindex[level].byteLength);
    }

    workBuf = malloc(dstRemainingByteLength + levelIndexByteLength);
    if (workBuf == NULL) {
        result = KTX_OUT_OF_MEMORY;
        goto cleanup;
    }
    nindex = (ktxLevelIndexEntry*)workBuf;
    pCmpDst = &workBuf[levelIndexByteLength];

    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        size_t levelByteLengthCmp =
            ZSTD_compressCCtx(cctx, pCmpDst + levelOffset,
                              dstRemainingByteLength,
                              &This->pData[cindex[level].byteOffset],
                              cindex[level].byteLength,
                              compressionLevel);
        if (ZSTD_isError(levelByteLengthCmp)) {
            free(workBuf);
            ZSTD_ErrorCode error = ZSTD_getErrorCode(levelByteLengthCmp);
            switch(error) {
              case ZSTD_error_parameter_outOfBound:
                result = KTX_INVALID_VALUE;
                goto cleanup;
              case ZSTD_error_dstSize_tooSmall:
#ifdef DEBUG
                assert(false && "Deflate dstSize too small.");
#else
                result = KTX_OUT_OF_MEMORY;
                goto cleanup;
#endif
              case ZSTD_error_workSpace_tooSmall:
#ifdef DEBUG
                assert(false && "Deflate workspace too small.");
#else
                result = KTX_OUT_OF_MEMORY;
                goto cleanup;
#endif
              case ZSTD_error_memory_allocation:
                result = KTX_OUT_OF_MEMORY;
                goto cleanup;
              default:
                // The remaining errors look like they should only
                // occur during decompression but just in case.
#ifdef DEBUG
                assert(true);
#else
                result = KTX_INVALID_OPERATION;
                goto cleanup;
#endif
            }
        }
        nindex[level].byteOffset = levelOffset;
        nindex[level].uncompressedByteLength = cindex[level].byteLength;
        nindex[level].byteLength = levelByteLengthCmp;
        byteLengthCmp += levelByteLengthCmp;
        levelOffset += levelByteLengthCmp;
        dstRemainingByteLength -= levelByteLengthCmp;
    }
    ZSTD_freeCCtx(cctx);

    // Move the compressed data into a correctly sized buffer.
    cmpData = malloc(byteLengthCmp);
    if (cmpData == NULL) {
        free(workBuf);
        return KTX_OUT_OF_MEMORY;
    }
    // Now modify the texture.
    memcpy(cmpData, pCmpDst, byteLengthCmp); // Copy data to sized buffer.
    memcpy(cindex, nindex, levelIndexByteLength); // Update level index
    free(workBuf);
    free(This->pData);
    This->pData = cmpData;
    This->dataSize = byteLengthCmp;
    This->supercompressionScheme = KTX_SS_ZSTD;
    This->_private->_requiredLevelAlignment = 1;

    return KTX_SUCCESS;

cleanup:
    ZSTD_freeCCtx(cctx);
    free(workBuf);
    return result;
}